

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

void __thiscall
CVmObjDict::enum_word_props
          (CVmObjDict *this,_func_void_void_ptr_vm_prop_id_t_vm_val_t_ptr *cb_func,void *cb_ctx,
          vm_val_t *strval,char *strp,size_t strl)

{
  uint hash;
  enum_word_props_ctx ctx;
  _func_void_void_ptr_vm_prop_id_t_vm_val_t_ptr *local_48;
  vm_val_t *local_40;
  char *local_38;
  size_t local_30;
  void *local_28;
  undefined8 local_20;
  CVmObjDict *local_18;
  
  local_20 = 0;
  local_48 = cb_func;
  local_40 = strval;
  local_38 = strp;
  local_30 = strl;
  local_28 = cb_ctx;
  local_18 = this;
  hash = calc_str_hash(this,strval,strp,strl);
  CVmHashTable::enum_hash_matches
            (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),hash,enum_word_props_cb,
             &local_48);
  return;
}

Assistant:

void CVmObjDict::enum_word_props(VMG_
                                 void (*cb_func)(VMG_ void *, vm_prop_id_t,
                                                 const vm_val_t *),
                                 void *cb_ctx, const vm_val_t *strval,
                                 const char *strp, size_t strl)
{
    enum_word_props_ctx ctx;
    unsigned int hash;

    /* set up the enumeration callback context */
    ctx.strval = strval;
    ctx.strp = strp;
    ctx.strl = strl;
    ctx.cb_func = cb_func;
    ctx.cb_ctx = cb_ctx;
    ctx.globals = VMGLOB_ADDR;
    ctx.dict = this;

    /* calculate the hash code */
    hash = calc_str_hash(vmg_ strval, strp, strl);

    /* enumerate the matches */
    get_ext()->hashtab_->enum_hash_matches(hash, &enum_word_props_cb, &ctx);
}